

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

uint32_t spvtools::opt::anon_unknown_0::NegateIntegerConstant
                   (ConstantManager *const_mgr,Constant *c)

{
  int iVar1;
  uint32_t uVar2;
  Type *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Constant *c_00;
  Instruction *this;
  Constant *negated_const;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  uint64_t local_40;
  uint64_t uval;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  uint32_t width;
  Constant *c_local;
  ConstantManager *const_mgr_local;
  
  if (c == (Constant *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0xe3,
                  "uint32_t spvtools::opt::(anonymous namespace)::NegateIntegerConstant(analysis::ConstantManager *, const analysis::Constant *)"
                 );
  }
  pTVar3 = analysis::Constant::type(c);
  iVar1 = (*pTVar3->_vptr_Type[10])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    pTVar3 = analysis::Constant::type(c);
    iVar1 = (*pTVar3->_vptr_Type[10])();
    words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         analysis::Integer::width((Integer *)CONCAT44(extraout_var_00,iVar1));
    if (words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != 0x20 &&
        words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != 0x40) {
      __assert_fail("width == 32 || width == 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0xe6,
                    "uint32_t spvtools::opt::(anonymous namespace)::NegateIntegerConstant(analysis::ConstantManager *, const analysis::Constant *)"
                   );
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&uval);
    if (words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == 0x40) {
      local_40 = analysis::Constant::GetU64(c);
      local_40 = -local_40;
      ExtractInts(&local_58,local_40);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&uval,&local_58);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_58);
    }
    else {
      uVar2 = analysis::Constant::GetU32(c);
      negated_const._4_4_ = -uVar2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&uval,
                 (value_type_conflict2 *)((long)&negated_const + 4));
    }
    pTVar3 = analysis::Constant::type(c);
    c_00 = analysis::ConstantManager::GetConstant
                     (const_mgr,pTVar3,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&uval)
    ;
    this = analysis::ConstantManager::GetDefiningInstruction(const_mgr,c_00,0,(inst_iterator *)0x0);
    uVar2 = Instruction::result_id(this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&uval);
    return uVar2;
  }
  __assert_fail("c->type()->AsInteger()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                ,0xe4,
                "uint32_t spvtools::opt::(anonymous namespace)::NegateIntegerConstant(analysis::ConstantManager *, const analysis::Constant *)"
               );
}

Assistant:

uint32_t NegateIntegerConstant(analysis::ConstantManager* const_mgr,
                               const analysis::Constant* c) {
  assert(c);
  assert(c->type()->AsInteger());
  uint32_t width = c->type()->AsInteger()->width();
  assert(width == 32 || width == 64);
  std::vector<uint32_t> words;
  if (width == 64) {
    uint64_t uval = static_cast<uint64_t>(0 - c->GetU64());
    words = ExtractInts(uval);
  } else {
    words.push_back(static_cast<uint32_t>(0 - c->GetU32()));
  }

  const analysis::Constant* negated_const =
      const_mgr->GetConstant(c->type(), std::move(words));
  return const_mgr->GetDefiningInstruction(negated_const)->result_id();
}